

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O2

int __thiscall
QNetworkAccessFileBackend::open(QNetworkAccessFileBackend *this,char *__file,int __oflag,...)

{
  QNetworkAccessFileBackend *pQVar1;
  long lVar2;
  char16_t *pcVar3;
  Data *pDVar4;
  qsizetype qVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  Operation OVar9;
  QIODevice *pQVar10;
  undefined4 *puVar11;
  NetworkError code;
  QStringBuilder<char16_t,_QString> *this_00;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  undefined8 uStackY_110;
  uint in_stack_fffffffffffffefc;
  QArrayDataPointer<char16_t> local_e8;
  QNetworkAccessBackend local_d0 [8];
  QObject local_c8 [8];
  QObject local_c0 [8];
  Data *local_b8;
  Data *pDStack_b0;
  char16_t *local_a8;
  QStringBuilder<char16_t,_QString> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QUrl url;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkAccessBackend::url((QNetworkAccessBackend *)&url);
  QUrl::host((QArrayDataPointer<char16_t> *)&local_98,(QNetworkAccessBackend *)&url,0x7f00000);
  local_58.d = (Data *)0x9;
  local_58.ptr = L"localhost";
  bVar6 = ::operator==((QString *)&local_98,(QLatin1StringView *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (bVar6) {
    local_98._0_8_ = (Data *)0x0;
    local_98.b.d.d = (Data *)0x0;
    local_98.b.d.ptr = (char16_t *)0x0;
    QUrl::setHost((QString *)&url,(ParsingMode)(QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  }
  QUrl::host((QArrayDataPointer<char16_t> *)&local_98,&url,0x7f00000);
  pcVar3 = local_98.b.d.ptr;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if ((Data *)pcVar3 != (Data *)0x0) {
    QCoreApplication::translate
              ((char *)&local_58,"QNetworkAccessFileBackend","Request for opening non-local file %1"
               ,0);
    QUrl::toString(&local_78,&url,0);
    QString::arg<QString,_true>
              ((QString *)&local_98,(QString *)&local_58,(QString *)&local_78,0,(QChar)0x20);
    QNetworkAccessBackend::error
              ((QNetworkAccessBackend *)this,ProtocolInvalidOperationError,(QString *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
    goto LAB_00176a55;
  }
  QUrl::path((QArrayDataPointer<char16_t> *)&local_98,&url,0x7f00000);
  pcVar3 = local_98.b.d.ptr;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if ((Data *)pcVar3 == (Data *)0x0) {
    latin1.m_data = "/";
    latin1.m_size = 1;
    QString::QString((QString *)&local_98,latin1);
    QUrl::setPath((QString *)&url,(ParsingMode)(QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  }
  QNetworkAccessBackend::setUrl((QNetworkAccessBackend *)this,&url);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::toLocalFile();
  if ((Data *)local_58.size == (Data *)0x0) {
    QUrl::scheme();
    local_78.d = (Data *)0x3;
    local_78.ptr = L"qrc";
    bVar6 = ::operator==((QString *)&local_98,(QLatin1StringView *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    if (bVar6) {
      this_00 = (QStringBuilder<char16_t,_QString> *)&local_b8;
      QUrl::path(this_00,&url,0x7f00000);
      local_98.b.d.size = (qsizetype)local_a8;
      local_98.b.d.ptr = (char16_t *)pDStack_b0;
      local_98.b.d.d = local_b8;
      local_98.a = 0x3a;
      local_b8 = (Data *)0x0;
      pDStack_b0 = (Data *)0x0;
      local_a8 = (char16_t *)0x0;
      QStringBuilder<char16_t,_QString>::convertTo<QString>((QString *)&local_78,&local_98);
      qVar5 = local_58.size;
      pcVar3 = local_58.ptr;
      pDVar4 = local_58.d;
      local_58.d = local_78.d;
      local_58.ptr = local_78.ptr;
      local_78.d = pDVar4;
      local_78.ptr = pcVar3;
      local_58.size = local_78.size;
      local_78.size = qVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98.b.d);
    }
    else {
      this_00 = &local_98;
      QUrl::toString(this_00,&url,0xde);
      qVar5 = local_58.size;
      pcVar3 = local_58.ptr;
      pDVar4 = local_58.d;
      local_58.d = (Data *)local_98._0_8_;
      local_58.ptr = (char16_t *)local_98.b.d.d;
      local_98._0_8_ = pDVar4;
      local_98.b.d.d = (Data *)pcVar3;
      local_58.size = (qsizetype)local_98.b.d.ptr;
      local_98.b.d.ptr = (char16_t *)qVar5;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
  }
  pQVar1 = this + 0x10;
  QFile::setFileName((QString *)pQVar1);
  OVar9 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
  if (OVar9 == GetOperation) {
    bVar6 = loadFileInfo(this);
    if (bVar6) goto LAB_00176867;
  }
  else {
LAB_00176867:
    OVar9 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
    if (OVar9 == GetOperation) {
      uStackY_110 = 0x21;
    }
    else {
      if (OVar9 != PutOperation) goto LAB_00176a48;
      QNetworkAccessBackend::createUploadByteDevice((QNetworkAccessBackend *)this);
      pQVar10 = QNetworkAccessBackend::uploadByteDevice((QNetworkAccessBackend *)this);
      QObject::connect(local_c0,(char *)pQVar10,(QObject *)"2readyRead()",(char *)this,0x23d655);
      QMetaObject::Connection::~Connection((Connection *)local_c0);
      QMetaObject::invokeMethod<>((QObject *)this,"uploadReadyReadSlot",QueuedConnection);
      uStackY_110 = 0x2a;
    }
    cVar7 = QFile::open(pQVar1,uStackY_110);
    cVar8 = QFileDevice::isSequential();
    if (cVar8 != '\0') {
      local_98._0_8_ = QIODevice::readChannelFinished;
      local_98.b.d.d = (Data *)0x0;
      puVar11 = (undefined4 *)operator_new(0x18);
      *puVar11 = 1;
      *(code **)(puVar11 + 2) =
           QtPrivate::
           QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkaccessfilebackend.cpp:137:63),_QtPrivate::List<>,_void>
           ::impl;
      *(QNetworkAccessFileBackend **)(puVar11 + 4) = this;
      QObject::connectImpl
                (local_c8,(void **)pQVar1,(QObject *)&local_98,(void **)this,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar11,(int *)((ulong)in_stack_fffffffffffffefc << 0x20),
                 (QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_c8);
    }
    if (cVar7 == '\0') {
      local_98.b.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QCoreApplication::translate
                ((char *)&local_78,"QNetworkAccessFileBackend","Error opening %1: %2",0);
      QNetworkAccessBackend::url(local_d0);
      QUrl::toString((QStringBuilder<char16_t,_QString> *)&local_b8,local_d0,0);
      QIODevice::errorString();
      QString::arg<QString,QString>
                ((type *)&local_98,(QString *)&local_78,(QString *)&local_b8,(QString *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
      QUrl::~QUrl((QUrl *)local_d0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      cVar7 = QFile::exists();
      code = ContentAccessDenied;
      if (cVar7 == '\0') {
        OVar9 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
        code = (uint)(OVar9 != PutOperation) * 2 + ContentAccessDenied;
      }
      QNetworkAccessBackend::error((QNetworkAccessBackend *)this,code,(QString *)&local_98);
      QNetworkAccessBackend::finished((QNetworkAccessBackend *)this);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    }
  }
LAB_00176a48:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_00176a55:
  QUrl::~QUrl(&url);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessFileBackend::open()
{
    QUrl url = this->url();

    if (url.host() == "localhost"_L1)
        url.setHost(QString());
#if !defined(Q_OS_WIN)
    // do not allow UNC paths on Unix
    if (!url.host().isEmpty()) {
        // we handle only local files
        error(QNetworkReply::ProtocolInvalidOperationError,
              QCoreApplication::translate("QNetworkAccessFileBackend", "Request for opening non-local file %1").arg(url.toString()));
        finished();
        return;
    }
#endif // !defined(Q_OS_WIN)
    if (url.path().isEmpty())
        url.setPath("/"_L1);
    setUrl(url);

    QString fileName = url.toLocalFile();
    if (fileName.isEmpty()) {
        if (url.scheme() == "qrc"_L1) {
            fileName = u':' + url.path();
        } else {
#if defined(Q_OS_ANDROID)
            if (url.scheme() == "assets"_L1)
                fileName = "assets:"_L1 + url.path();
            else
#endif
                fileName = url.toString(QUrl::RemoveAuthority | QUrl::RemoveFragment | QUrl::RemoveQuery);
        }
    }
    file.setFileName(fileName);

    if (operation() == QNetworkAccessManager::GetOperation) {
        if (!loadFileInfo())
            return;
    }

    QIODevice::OpenMode mode;
    switch (operation()) {
    case QNetworkAccessManager::GetOperation:
        mode = QIODevice::ReadOnly;
        break;
    case QNetworkAccessManager::PutOperation:
        mode = QIODevice::WriteOnly | QIODevice::Truncate;
        createUploadByteDevice();
        QObject::connect(uploadByteDevice(), SIGNAL(readyRead()), this, SLOT(uploadReadyReadSlot()));
        QMetaObject::invokeMethod(this, "uploadReadyReadSlot", Qt::QueuedConnection);
        break;
    default:
        Q_ASSERT_X(false, "QNetworkAccessFileBackend::open",
                   "Got a request operation I cannot handle!!");
        return;
    }

    mode |= QIODevice::Unbuffered;
    bool opened = file.open(mode);
    if (file.isSequential())
        connect(&file, &QIODevice::readChannelFinished, this, [this]() { finished(); });

    // could we open the file?
    if (!opened) {
        QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Error opening %1: %2")
                                                .arg(this->url().toString(), file.errorString());

        // why couldn't we open the file?
        // if we're opening for reading, either it doesn't exist, or it's access denied
        // if we're opening for writing, not existing means it's access denied too
        if (file.exists() || operation() == QNetworkAccessManager::PutOperation)
            error(QNetworkReply::ContentAccessDenied, msg);
        else
            error(QNetworkReply::ContentNotFoundError, msg);
        finished();
    }
}